

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_dump(opj_j2k_v2_t *p_j2k,OPJ_INT32 flag,FILE *out_stream)

{
  FILE *in_RDX;
  uint in_ESI;
  FILE *in_RDI;
  undefined4 in_stack_00000008;
  undefined4 in_stack_fffffffffffffff0;
  
  if (((in_ESI & 0x80) == 0) && ((in_ESI & 0x100) == 0)) {
    if (((in_ESI & 1) != 0) && (in_RDI->_markers != (_IO_marker *)0x0)) {
      j2k_dump_image_header
                ((opj_image_t *)out_stream,(opj_bool)((ulong)in_RDI >> 0x20),
                 (FILE *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    }
    if ((in_ESI & 2) != 0) {
      j2k_dump_MH_info(p_j2k,(FILE *)CONCAT44(flag,in_stack_00000008));
    }
    if ((in_ESI & 0x10) != 0) {
      j2k_dump_MH_index((opj_j2k_v2_t *)out_stream,in_RDI);
    }
  }
  else {
    fprintf(in_RDX,"Wrong flag\n");
  }
  return;
}

Assistant:

void j2k_dump (opj_j2k_v2_t* p_j2k, OPJ_INT32 flag, FILE* out_stream)
{
	/* Check if the flag is compatible with j2k file*/
	if ( (flag & OPJ_JP2_INFO) || (flag & OPJ_JP2_IND)){
		fprintf(out_stream, "Wrong flag\n");
		return;
	}

	/* Dump the image_header */
	if (flag & OPJ_IMG_INFO){
		if (p_j2k->m_private_image)
			j2k_dump_image_header(p_j2k->m_private_image, 0, out_stream);
	}

	/* Dump the codestream info from main header */
	if (flag & OPJ_J2K_MH_INFO){
		j2k_dump_MH_info(p_j2k, out_stream);
	}


	/* Dump the codestream info of the current tile */
	if (flag & OPJ_J2K_TH_INFO){

	}

	/* Dump the codestream index from main header */
	if (flag & OPJ_J2K_MH_IND){
		j2k_dump_MH_index(p_j2k, out_stream);
	}

	/* Dump the codestream index of the current tile */
	if (flag & OPJ_J2K_TH_IND){

	}

}